

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peeker.hpp
# Opt level: O1

void __thiscall
boost::xpressive::detail::xpression_peeker<char>::
accept<boost::xpressive::detail::alternates_vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
          (xpression_peeker<char> *this,
          alternate_matcher<boost::xpressive::detail::alternates_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
          *xpr)

{
  _WordT *p_Var1;
  hash_peek_bitset<char> *this_00;
  bool bVar2;
  size_t __i;
  long lVar3;
  
  this_00 = this->bset_;
  bVar2 = hash_peek_bitset<char>::test_icase_(this_00,(xpr->bset_).icase_);
  if (bVar2) {
    lVar3 = 0;
    do {
      p_Var1 = (this_00->bset_).super__Base_bitset<4UL>._M_w + lVar3;
      *p_Var1 = *p_Var1 | (xpr->bset_).bset_.super__Base_bitset<4UL>._M_w[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
  }
  return;
}

Assistant:

mpl::false_ accept(alternate_matcher<Alternates, Traits> const &xpr)
    {
        BOOST_ASSERT(0 != xpr.bset_.count());
        this->bset_.set_bitset(xpr.bset_);
        return mpl::false_();
    }